

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall cmInstallExportGenerator::~cmInstallExportGenerator(cmInstallExportGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmExportInstallFileGenerator *pcVar2;
  pointer pcVar3;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_00b29f10;
  pcVar2 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  if (pcVar2 != (cmExportInstallFileGenerator *)0x0) {
    (**(code **)((long)(pcVar2->super_cmExportFileGenerator)._vptr_cmExportFileGenerator + 8))();
  }
  (this->EFGen)._M_t.
  super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
  .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl =
       (cmExportInstallFileGenerator *)0x0;
  pcVar3 = (this->MainImportFile)._M_dataplus._M_p;
  paVar1 = &(this->MainImportFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TempDir)._M_dataplus._M_p;
  paVar1 = &(this->TempDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CxxModulesDirectory)._M_dataplus._M_p;
  paVar1 = &(this->CxxModulesDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->Namespace)._M_dataplus._M_p;
  paVar1 = &(this->Namespace).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->FileName)._M_dataplus._M_p;
  paVar1 = &(this->FileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->FilePermissions)._M_dataplus._M_p;
  paVar1 = &(this->FilePermissions).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

cmInstallExportGenerator::~cmInstallExportGenerator() = default;